

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     PrintWithFallback<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*>
               (TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL> **value,ostream *os)

{
  PointerPrinter::PrintValue<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>>
            (*value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      ProtobufPrinter,
#ifdef GTEST_HAS_ABSL
      ConvertibleToAbslStringifyPrinter,
#endif  // GTEST_HAS_ABSL
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ConvertibleToIntegerPrinter, ConvertibleToStringViewPrinter,
      RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}